

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Congestion.cpp
# Opt level: O1

void __thiscall Congestion::updateRTT(Congestion *this,double start,double end)

{
  double dVar1;
  double dVar2;
  
  dVar1 = this->RTTs * 0.875 + (end - start) * 0.125;
  this->RTTs = dVar1;
  dVar2 = this->RTTd * 0.75 + ABS(dVar1 - (end - start)) * 0.25;
  this->RTTd = dVar2;
  this->RTO = dVar2 * 4.0 + dVar1;
  return;
}

Assistant:

void Congestion::updateRTT(double start, double end) {
    float a = 0.125; //计算新 RTT 样本值时加权 RFC 6298 推荐值
    float b = 0.25; //计算 RTT 的偏差的加权平均值时 RFC 6298 推荐值
    double newSampleRTT = end - start;
    RTTs = (1.0 - a) * RTTs + (a * newSampleRTT);
    RTTd = (1.0 - b) * RTTd + (b * abs(RTTs - newSampleRTT));
    RTO = RTTs + 4 * RTTd;
}